

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall cfd::core::ConfidentialTransaction::RandomSortTxOut(ConfidentialTransaction *this)

{
  uint uVar1;
  void *pvVar2;
  CfdException *this_00;
  long lVar3;
  pointer pCVar4;
  size_t index;
  ulong uVar5;
  ulong uVar6;
  Amount AVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  ConfidentialValue local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_118;
  ulong local_100;
  void *local_f8 [2];
  long local_e8;
  void *local_e0 [2];
  long local_d0;
  Amount local_c8;
  Script local_b8;
  ConfidentialNonce local_80;
  ConfidentialAssetId local_58;
  
  GetTxOutList(&local_118,this);
  if (local_118.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_118.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    pCVar4 = local_118.
             super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    lVar3 = 0x78;
    uVar6 = 0;
    do {
      ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&local_b8,
                 (ConfidentialValue *)
                 ((long)&((local_118.
                           super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference)
                         ._vptr_AbstractTxOutReference + lVar3));
      if (1 < (byte)local_b8.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        local_158._vptr_ConfidentialValue = (_func_int **)0x61799b;
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xcfc;
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = "RandomSortTxOut";
        logger::log<>((CfdSourceLocation *)&local_158,kCfdLogLevelWarning,"already blinded tx");
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_158._vptr_ConfidentialValue =
             (_func_int **)
             ((long)&local_158.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"already blinded tx","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_158);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_b8._vptr_Script = (_func_int **)&PTR__ConfidentialValue_0086dde8;
      if (local_b8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + 1;
      uVar5 = ((long)local_118.
                     super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
      lVar3 = lVar3 + 0xf8;
      pCVar4 = local_118.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < uVar5);
  }
  if (uVar5 != 0) {
    do {
      AbstractTransaction::RemoveTxOut(&this->super_AbstractTransaction,(uint32_t)(uVar5 - 1));
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      _M_erase(&this->vout_,
               (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar5 - 1 & 0xffffffff));
      uVar5 = uVar5 - 1;
      pCVar4 = local_118.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 != 0);
  }
  RandomNumberUtil::GetRandomIndexes
            (&local_130,
             (int)((ulong)((long)local_118.
                                 super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) >> 3) *
             -0x42108421);
  if (local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      pCVar4 = local_118.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      local_100 = uVar5;
      ConfidentialValue::ConfidentialValue
                (&local_158,
                 &local_118.
                  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].confidential_value_);
      AVar7 = ConfidentialValue::GetAmount(&local_158);
      local_c8.amount_ = AVar7.amount_;
      local_c8.ignore_check_ = AVar7.ignore_check_;
      ConfidentialAssetId::ConfidentialAssetId(&local_58,&pCVar4[uVar1].asset_);
      Script::Script(&local_b8,&pCVar4[uVar1].super_AbstractTxOutReference.locking_script_);
      ConfidentialNonce::ConfidentialNonce(&local_80,&pCVar4[uVar1].nonce_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
                 &pCVar4[uVar1].surjection_proof_.data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,
                 &pCVar4[uVar1].range_proof_.data_);
      AddTxOut(this,&local_c8,&local_58,&local_b8,&local_80,(ByteData *)local_e0,
               (ByteData *)local_f8);
      if (local_f8[0] != (void *)0x0) {
        operator_delete(local_f8[0],local_e8 - (long)local_f8[0]);
      }
      if (local_e0[0] != (void *)0x0) {
        operator_delete(local_e0[0],local_d0 - (long)local_e0[0]);
      }
      local_80._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0086dcb8;
      if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Script::~Script(&local_b8);
      local_58._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
      if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_158._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0086dde8;
      pvVar2 = (void *)CONCAT44(local_158.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_158.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_158.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      uVar5 = local_100 + 1;
    } while (uVar5 < (ulong)((long)local_130.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_130.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&local_118);
  return;
}

Assistant:

void ConfidentialTransaction::RandomSortTxOut() {
  const std::vector<ConfidentialTxOutReference> &txout_list = GetTxOutList();
  // blind check
  for (size_t index = 0; index < txout_list.size(); ++index) {
    const ConfidentialValue &value = txout_list[index].GetConfidentialValue();
    if (value.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "already blinded tx");
      throw CfdException(kCfdIllegalArgumentError, "already blinded tx");
    }
  }
  for (size_t index = txout_list.size(); index > 0; --index) {
    RemoveTxOut(static_cast<uint32_t>(index - 1));
  }

  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(
      static_cast<uint32_t>(txout_list.size()));
  for (size_t index = 0; index < indexes.size(); ++index) {
    const ConfidentialTxOutReference &txout = txout_list[indexes[index]];
    AddTxOut(
        txout.GetConfidentialValue().GetAmount(), txout.GetAsset(),
        txout.GetLockingScript(), txout.GetNonce(), txout.GetSurjectionProof(),
        txout.GetRangeProof());
  }
}